

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_DCData.cpp
# Opt level: O0

h__Writer * __thiscall
ASDCP::DCData::MXFWriter::h__Writer::OpenWrite
          (h__Writer *this,string *filename,ui32_t HeaderSize,SubDescriptorList_t *subDescriptors)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  DCDataDescriptor *this_00;
  reference ppIVar4;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> *in_R8;
  h__WriterState local_c8 [26];
  _List_node_base *local_60;
  _Self local_58;
  const_iterator lastDescriptor;
  const_iterator sDObj;
  SubDescriptorList_t *subDescriptors_local;
  ui32_t HeaderSize_local;
  string *filename_local;
  h__Writer *this_local;
  Result_t *result;
  
  bVar2 = MXF::h__WriterState::Test_BEGIN((h__WriterState *)&filename[0x1b].field_2);
  if (bVar2) {
    Kumu::FileWriter::OpenWrite((string *)this);
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar3) {
      *(int *)&filename[2]._M_string_length = (int)subDescriptors;
      this_00 = (DCDataDescriptor *)operator_new(0x170);
      MXF::DCDataDescriptor::DCDataDescriptor(this_00,(Dictionary *)filename->_M_string_length);
      *(DCDataDescriptor **)((long)&filename[0x18].field_2 + 8) = this_00;
      std::_List_const_iterator<ASDCP::MXF::InterchangeObject_*>::_List_const_iterator
                (&lastDescriptor);
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
           end(in_R8);
      local_60 = (_List_node_base *)
                 std::__cxx11::
                 list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                 ::begin(in_R8);
      lastDescriptor = (const_iterator)local_60;
      while (bVar2 = std::operator!=(&lastDescriptor,&local_58), bVar2) {
        ppIVar4 = std::_List_const_iterator<ASDCP::MXF::InterchangeObject_*>::operator*
                            (&lastDescriptor);
        std::__cxx11::
        list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
        push_back((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                   *)(filename + 0x19),ppIVar4);
        ppIVar4 = std::_List_const_iterator<ASDCP::MXF::InterchangeObject_*>::operator*
                            (&lastDescriptor);
        Kumu::GenRandomValue(&(*ppIVar4)->InstanceUID);
        lVar1 = *(long *)((long)&filename[0x18].field_2 + 8);
        ppIVar4 = std::_List_const_iterator<ASDCP::MXF::InterchangeObject_*>::operator*
                            (&lastDescriptor);
        std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
                  ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)(lVar1 + 200),
                   &(*ppIVar4)->InstanceUID);
        std::_List_const_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&lastDescriptor);
      }
      MXF::h__WriterState::Goto_INIT(local_c8);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_c8);
      Kumu::Result_t::~Result_t((Result_t *)local_c8);
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ui32_t HeaderSize,
                                    const SubDescriptorList_t& subDescriptors)
{
  if ( ! m_State.Test_BEGIN() )
    return RESULT_STATE;

  Result_t result = m_File.OpenWrite(filename);

  if ( ASDCP_SUCCESS(result) )
    {
      m_HeaderSize = HeaderSize;
      m_EssenceDescriptor = new MXF::DCDataDescriptor(m_Dict);
      SubDescriptorList_t::const_iterator sDObj;
      SubDescriptorList_t::const_iterator lastDescriptor = subDescriptors.end();
      for (sDObj = subDescriptors.begin(); sDObj != lastDescriptor; ++sDObj)
      {
          m_EssenceSubDescriptorList.push_back(*sDObj);
          GenRandomValue((*sDObj)->InstanceUID);
          m_EssenceDescriptor->SubDescriptors.push_back((*sDObj)->InstanceUID);
      }
      result = m_State.Goto_INIT();
    }

  return result;
}